

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

appender fmt::v8::detail::write<char,fmt::v8::appender>
                   (appender out,char value,basic_format_specs<char> *specs,locale_ref loc)

{
  bool bVar1;
  error_handler local_31;
  basic_format_specs<char> *local_30;
  basic_format_specs<char> *specs_local;
  locale_ref lStack_20;
  char value_local;
  locale_ref loc_local;
  appender out_local;
  
  local_30 = specs;
  specs_local._7_1_ = value;
  lStack_20.locale_ = loc.locale_;
  loc_local.locale_ =
       (void *)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container;
  bVar1 = check_char_specs<char,fmt::v8::detail::error_handler>(specs,&local_31);
  if (bVar1) {
    out_local = write_char<char,fmt::v8::appender>
                          ((appender)loc_local.locale_,specs_local._7_1_,local_30);
  }
  else {
    out_local = write<char,_fmt::v8::appender,_int,_0>
                          ((appender)loc_local.locale_,(int)specs_local._7_1_,local_30,lStack_20);
  }
  return (appender)
         out_local.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container.container;
}

Assistant:

FMT_CONSTEXPR auto write(OutputIt out, Char value,
                         const basic_format_specs<Char>& specs,
                         locale_ref loc = {}) -> OutputIt {
  return check_char_specs(specs)
             ? write_char(out, value, specs)
             : write(out, static_cast<int>(value), specs, loc);
}